

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

LY_ERR ly_ctx_unset_searchdir(ly_ctx *ctx,char *value)

{
  int iVar1;
  uint local_24;
  uint32_t index;
  char *value_local;
  ly_ctx *ctx_local;
  
  if (ctx == (ly_ctx *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ctx",
           "ly_ctx_unset_searchdir");
    ctx_local._4_4_ = LY_EINVAL;
  }
  else if ((ctx->search_paths).count == 0) {
    ctx_local._4_4_ = LY_SUCCESS;
  }
  else if (value == (char *)0x0) {
    ly_set_erase(&ctx->search_paths,free);
    memset(&ctx->search_paths,0,0x10);
    ctx_local._4_4_ = LY_SUCCESS;
  }
  else {
    local_24 = 0;
    while ((local_24 < (ctx->search_paths).count &&
           (iVar1 = strcmp(value,(char *)(ctx->search_paths).field_2.dnodes[local_24]), iVar1 != 0))
          ) {
      local_24 = local_24 + 1;
    }
    if (local_24 == (ctx->search_paths).count) {
      ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","value","ly_ctx_unset_searchdir");
      ctx_local._4_4_ = LY_EINVAL;
    }
    else {
      ctx_local._4_4_ = ly_set_rm_index(&ctx->search_paths,local_24,free);
    }
  }
  return ctx_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_ctx_unset_searchdir(struct ly_ctx *ctx, const char *value)
{
    LY_CHECK_ARG_RET(ctx, ctx, LY_EINVAL);

    if (!ctx->search_paths.count) {
        return LY_SUCCESS;
    }

    if (value) {
        /* remove specific search directory */
        uint32_t index;

        for (index = 0; index < ctx->search_paths.count; ++index) {
            if (!strcmp(value, ctx->search_paths.objs[index])) {
                break;
            }
        }
        if (index == ctx->search_paths.count) {
            LOGARG(ctx, value);
            return LY_EINVAL;
        } else {
            return ly_set_rm_index(&ctx->search_paths, index, free);
        }
    } else {
        /* remove them all */
        ly_set_erase(&ctx->search_paths, free);
        memset(&ctx->search_paths, 0, sizeof ctx->search_paths);
    }

    return LY_SUCCESS;
}